

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

Page * page_merge_hot(Page *pA,Page *pB)

{
  Page *pPVar1;
  Page *pPVar2;
  bool bVar3;
  bool bVar4;
  Page local_68;
  
  bVar3 = pA != (Page *)0x0;
  bVar4 = pB != (Page *)0x0;
  local_68.pPrevHot = (Page *)0x0;
  if (bVar3 && bVar4) {
    pPVar1 = &local_68;
    pPVar2 = pB;
    do {
      if (pA->pgno < pPVar2->pgno) {
        pPVar1->pPrevHot = pA;
        pA->pNextHot = pPVar1;
        pPVar1 = pA;
        pB = pPVar2;
        pA = pA->pPrevHot;
      }
      else {
        pPVar1->pPrevHot = pPVar2;
        pPVar2->pNextHot = pPVar1;
        pB = pPVar2->pPrevHot;
        pPVar1 = pPVar2;
      }
      bVar4 = pB != (Page *)0x0;
      bVar3 = pA != (Page *)0x0;
    } while ((bVar3) && (pPVar2 = pB, pB != (Page *)0x0));
  }
  else {
    pPVar1 = &local_68;
  }
  if (bVar3) {
    pPVar1->pPrevHot = pA;
    pA->pNextHot = pPVar1;
  }
  else if (bVar4) {
    pPVar1->pPrevHot = pB;
    pB->pNextHot = pPVar1;
  }
  else {
    pPVar1->pNextHot = (Page *)0x0;
    pPVar1->pPrevHot = (Page *)0x0;
  }
  return local_68.pPrevHot;
}

Assistant:

static Page * page_merge_hot(Page *pA, Page *pB)
{
	Page result, *pTail;
    /* Prevent compiler warning */
	result.pNextHot = result.pPrevHot = 0;
	pTail = &result;
	while( pA && pB ){
		if( pA->pgno < pB->pgno ){
			pTail->pPrevHot = pA;
			pA->pNextHot = pTail;
			pTail = pA;
			pA = pA->pPrevHot;
		}else{
			pTail->pPrevHot = pB;
			pB->pNextHot = pTail;
			pTail = pB;
			pB = pB->pPrevHot;
		}
	}
	if( pA ){
		pTail->pPrevHot = pA;
		pA->pNextHot = pTail;
	}else if( pB ){
		pTail->pPrevHot = pB;
		pB->pNextHot = pTail;
	}else{
		pTail->pPrevHot = pTail->pNextHot = 0;
	}
	return result.pPrevHot;
}